

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::updateOkButtonText(QFileDialogPrivate *this,bool saveAsOnFolder)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,saveAsOnFolder) == 0) {
    cVar1 = QFileDialogOptions::isLabelExplicitlySet((DialogLabel)(this->options).value.ptr);
    if (cVar1 != '\0') {
      QFileDialogOptions::labelText((DialogLabel)&local_30);
      goto LAB_004df789;
    }
    iVar2 = QFileDialogOptions::fileMode();
    if (iVar2 == 2) {
      iVar3 = 0x6e5997;
    }
    else {
      iVar2 = QFileDialogOptions::acceptMode();
      iVar3 = 0x6e599f;
      if (iVar2 == 0) {
        iVar3 = 0x6e5991;
      }
    }
  }
  else {
    iVar3 = 0x6e5991;
  }
  QMetaObject::tr((char *)&local_30,(char *)&QFileDialog::staticMetaObject,iVar3);
LAB_004df789:
  setLabelTextControl(this,Accept,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::updateOkButtonText(bool saveAsOnFolder)
{
    Q_Q(QFileDialog);
    // 'Save as' at a folder: Temporarily change to "Open".
    if (saveAsOnFolder) {
        setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Open"));
    } else if (options->isLabelExplicitlySet(QFileDialogOptions::Accept)) {
        setLabelTextControl(QFileDialog::Accept, options->labelText(QFileDialogOptions::Accept));
        return;
    } else {
        switch (q->fileMode()) {
        case QFileDialog::Directory:
            setLabelTextControl(QFileDialog::Accept, QFileDialog::tr("&Choose"));
            break;
        default:
            setLabelTextControl(QFileDialog::Accept,
                                q->acceptMode() == QFileDialog::AcceptOpen ?
                                    QFileDialog::tr("&Open")  :
                                    QFileDialog::tr("&Save"));
            break;
        }
    }
}